

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

string * __thiscall
duckdb::ColumnDataCollection::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ColumnDataCollection *this)

{
  bool bVar1;
  string *psVar2;
  unsigned_long in_R8;
  unsigned_long in_R9;
  unsigned_long params;
  allocator local_1a1;
  string *local_1a0;
  ColumnDataCollection *local_198;
  Exception local_190 [2];
  DataChunk chunk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0 [32];
  string local_d0;
  ColumnDataScanState scan_state;
  
  local_1a0 = __return_storage_ptr__;
  DataChunk::DataChunk(&chunk);
  InitializeScanChunk(this,&chunk);
  scan_state.current_chunk_state.handles._M_h._M_buckets =
       &scan_state.current_chunk_state.handles._M_h._M_single_bucket;
  scan_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
  scan_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  scan_state.current_chunk_state.handles._M_h._M_element_count = 0;
  scan_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  scan_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  scan_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  scan_state.current_chunk_state.properties = INVALID;
  scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  InitializeScan(this,&scan_state,ALLOW_ZERO_COPY);
  ::std::__cxx11::string::string
            ((string *)local_190,"ColumnDataCollection - [%llu Chunks, %llu Rows]\n",
             (allocator *)&local_130);
  psVar2 = (string *)ChunkCount(this);
  Exception::ConstructMessage<unsigned_long,unsigned_long>
            (local_1a0,local_190,psVar2,this->count,in_R8);
  local_198 = this;
  ::std::__cxx11::string::~string((string *)local_190);
  psVar2 = (string *)0x0;
  params = 0;
  while( true ) {
    bVar1 = Scan(local_198,&scan_state,&chunk);
    if (!bVar1) break;
    ::std::__cxx11::string::string(local_f0,"Chunk %llu - [Rows %llu - %llu]\n",&local_1a1);
    Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long>
              (&local_d0,(Exception *)local_f0,psVar2,params,chunk.count + params,in_R9);
    DataChunk::ToString_abi_cxx11_(&local_110,&chunk);
    ::std::operator+(&local_130,&local_d0,&local_110);
    ::std::__cxx11::string::append((string *)local_1a0);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string(local_f0);
    psVar2 = (string *)((long)&(psVar2->_M_dataplus)._M_p + 1);
    params = params + chunk.count;
  }
  ColumnDataScanState::~ColumnDataScanState(&scan_state);
  DataChunk::~DataChunk(&chunk);
  return local_1a0;
}

Assistant:

string ColumnDataCollection::ToString() const {
	DataChunk chunk;
	InitializeScanChunk(chunk);

	ColumnDataScanState scan_state;
	InitializeScan(scan_state);

	string result = StringUtil::Format("ColumnDataCollection - [%llu Chunks, %llu Rows]\n", ChunkCount(), Count());
	idx_t chunk_idx = 0;
	idx_t row_count = 0;
	while (Scan(scan_state, chunk)) {
		result +=
		    StringUtil::Format("Chunk %llu - [Rows %llu - %llu]\n", chunk_idx, row_count, row_count + chunk.size()) +
		    chunk.ToString();
		chunk_idx++;
		row_count += chunk.size();
	}

	return result;
}